

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void P_TranslatePortalVXVY(line_t_conflict *src,double *velx,double *vely)

{
  double dVar1;
  double dVar2;
  FLinePortal *port_00;
  double orig_vely;
  double orig_velx;
  FLinePortal *port;
  double *vely_local;
  double *velx_local;
  line_t_conflict *src_local;
  
  if ((src != (line_t_conflict *)0x0) &&
     (port_00 = line_t::getPortal((line_t *)src), port_00 != (FLinePortal *)0x0)) {
    if ((port_00->mFlags & 0x10) != 0) {
      SetRotation(port_00);
    }
    dVar1 = *velx;
    dVar2 = *vely;
    *velx = dVar1 * port_00->mCosRot - dVar2 * port_00->mSinRot;
    *vely = dVar2 * port_00->mCosRot + dVar1 * port_00->mSinRot;
  }
  return;
}

Assistant:

void P_TranslatePortalVXVY(line_t* src, double &velx, double &vely)
{
	if (!src) return;
	FLinePortal *port = src->getPortal();
	if (!port) return;
	if (port->mFlags & PORTF_POLYOBJ) SetRotation(port);	// update the angle for polyportals.

	double orig_velx = velx;
	double orig_vely = vely;
	velx = orig_velx * port->mCosRot - orig_vely * port->mSinRot;
	vely = orig_vely * port->mCosRot + orig_velx * port->mSinRot;
}